

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O2

int libj1939_socket_prio(int sock,int prio)

{
  FILE *__stream;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  uint __errnum;
  int prio_local;
  
  prio_local = prio;
  iVar1 = setsockopt(sock,0x6b,3,&prio_local,4);
  __errnum = 0;
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    iVar1 = prio_local;
    __stream = _stderr;
    __errnum = -*piVar2;
    pcVar3 = strerror(__errnum);
    fprintf(__stream,"Failed to set priority %i. Error %i (%s)",(ulong)(uint)iVar1,(ulong)__errnum,
            pcVar3);
  }
  return __errnum;
}

Assistant:

int libj1939_socket_prio(int sock, int prio)
{
	int ret;

	ret = setsockopt(sock, SOL_CAN_J1939, SO_J1939_SEND_PRIO,
			 &prio, sizeof(prio));
	if (ret < 0) {
		ret = -errno;
		pr_warn("Failed to set priority %i. Error %i (%s)", prio, ret,
			strerror(ret));
		return ret;
	}

	return 0;
}